

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall Memory::Recycler::DeleteGuestArena(Recycler *this,ArenaAllocator *arenaAllocator)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (this->hasPendingConcurrentFindRoot == true) {
    bVar2 = DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::HasElement
                      (&this->guestArenaList,(GuestArenaAllocator *)arenaAllocator);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x21c5,"(guestArenaList.HasElement(guestArenaAllocator))",
                         "guestArenaList.HasElement(guestArenaAllocator)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    this->hasPendingDeleteGuestArena = true;
    *(undefined1 *)
     &arenaAllocator[1].super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
      super_Allocator.outOfMemoryFunc = 1;
  }
  else {
    DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::
    RemoveElement<Memory::HeapAllocator>
              (&this->guestArenaList,&HeapAllocator::Instance,(GuestArenaAllocator *)arenaAllocator)
    ;
  }
  CollectNow<(Memory::CollectionFlags)8320>(this);
  return;
}

Assistant:

void
Recycler::DeleteGuestArena(ArenaAllocator * arenaAllocator)
{
    GuestArenaAllocator * guestArenaAllocator = static_cast<GuestArenaAllocator *>(arenaAllocator);
#if ENABLE_CONCURRENT_GC
    if (this->hasPendingConcurrentFindRoot)
    {
        // We are doing concurrent find root, don't modify the list and mark the arena to be delete
        // later when we do find root in thread.
        Assert(guestArenaList.HasElement(guestArenaAllocator));
        this->hasPendingDeleteGuestArena = true;
        guestArenaAllocator->pendingDelete = true;
    }
    else
#endif
    {
        guestArenaList.RemoveElement(&HeapAllocator::Instance, guestArenaAllocator);
    }

    // Any time a root is removed during a GC, it indicates that an exhaustive
    // collection is likely going to have work to do so trigger an exhaustive
    // candidate GC to indicate this fact
    this->CollectNow<CollectExhaustiveCandidate>();
}